

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_xu_index.c
# Opt level: O3

int dwarf_get_debugfission_for_key
              (Dwarf_Debug dbg,Dwarf_Sig8 *key,char *key_type,Dwarf_Debug_Fission_Per_CU *percu_out,
              Dwarf_Error *error)

{
  Dwarf_Xu_Index_Header xuhdr_00;
  int iVar1;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Xu_Index_Header xuhdr;
  Dwarf_Unsigned percu_index;
  Dwarf_Xu_Index_Header local_40;
  Dwarf_Unsigned local_38;
  
  local_38 = 0;
  local_40 = (Dwarf_Xu_Index_Header)0x0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_debugfission_for_key()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
  }
  else {
    if ((key_type != (char *)0x0 && key != (Dwarf_Sig8 *)0x0) &&
        percu_out != (Dwarf_Debug_Fission_Per_CU *)0x0) {
      iVar1 = _dwarf_load_debug_info(dbg,error);
      if (iVar1 == 1) {
        return 1;
      }
      iVar1 = _dwarf_load_debug_types(dbg,error);
      if (iVar1 == 1) {
        return 1;
      }
      iVar1 = _dwarf_get_xuhdr(dbg,key_type,&local_40,error);
      xuhdr_00 = local_40;
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = _dwarf_search_fission_for_key(dbg,local_40,key,&local_38,error);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = transform_xu_to_dfp(xuhdr_00,local_38,key,key_type,percu_out,error);
      return iVar1;
    }
    msg = 
    "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or Dwarf_Debug_Fission_Per_CU pointer* to return is not valid"
    ;
    errval = 0x10c;
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_get_debugfission_for_key(Dwarf_Debug dbg,
    Dwarf_Sig8  *key  /* pointer to hash signature */,
    const char  *key_type  /*  "cu" or "tu" */,
    Dwarf_Debug_Fission_Per_CU *  percu_out,
    Dwarf_Error *error)
{
    int sres = 0;
    Dwarf_Unsigned percu_index = 0;
    Dwarf_Xu_Index_Header xuhdr = 0;

    CHECK_DBG(dbg,error,"dwarf_get_debugfission_for_key()");
    if (!key || !key_type || !percu_out) {
        _dwarf_error_string(0,error,DW_DLE_XU_TYPE_ARG_ERROR,
            "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or "
            "Dwarf_Debug_Fission_Per_CU pointer* to return "
            "is not valid");
        return DW_DLV_ERROR;
    }

    sres = _dwarf_load_debug_info(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    sres = _dwarf_load_debug_types(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    /*  Returns already existing xuhdr */
    sres = _dwarf_get_xuhdr(dbg,key_type, &xuhdr,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    /*  Search in that xu data. */
    sres = _dwarf_search_fission_for_key(dbg,
        xuhdr,key,&percu_index,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    sres = transform_xu_to_dfp(xuhdr,percu_index,key,
        key_type,percu_out,error);
    return sres;
}